

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c219.c
# Opt level: O0

UINT8 c219_r(void *chip,UINT16 offset)

{
  c219_state *info;
  UINT16 offset_local;
  void *chip_local;
  
  info._6_2_ = offset & 0x1ff;
  if ((0x1f7 < info._6_2_) && ((offset & 1) != 0)) {
    info._6_2_ = offset & 0x1f7;
  }
  if (((info._6_2_ & 0xf) == 5) && (info._6_2_ < 0x100)) {
    chip_local._7_1_ = c219_keyon_status_read((c219_state *)chip,info._6_2_);
  }
  else {
    chip_local._7_1_ = *(UINT8 *)((long)chip + (ulong)info._6_2_ + 0x20);
  }
  return chip_local._7_1_;
}

Assistant:

static UINT8 c219_r(void *chip, UINT16 offset)
{
	c219_state *info = (c219_state *)chip;
	offset &= 0x1ff;
	if (offset >= 0x1f8 && (offset & 0x001))
		offset &= ~0x008;

	// assume same as c140
	// TODO: what happens here on reading unmapped voice regs?
	if ((offset & 0xf) == 0x5 && offset < 0x100)
		return c219_keyon_status_read(info, offset);

	return info->REG[offset];
}